

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_upgrade
              (nghttp2_session *session,uint8_t *settings_payload,size_t settings_payloadlen,
              void *stream_user_data)

{
  nghttp2_stream *pnVar1;
  nghttp2_stream *stream;
  int rv;
  void *stream_user_data_local;
  size_t settings_payloadlen_local;
  uint8_t *settings_payload_local;
  nghttp2_session *session_local;
  
  session_local._4_4_ =
       nghttp2_session_upgrade_internal
                 (session,settings_payload,settings_payloadlen,stream_user_data);
  if (session_local._4_4_ == 0) {
    pnVar1 = nghttp2_session_get_stream(session,1);
    if (pnVar1 == (nghttp2_stream *)0x0) {
      __assert_fail("stream",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0x1fb8,
                    "int nghttp2_session_upgrade(nghttp2_session *, const uint8_t *, size_t, void *)"
                   );
    }
    pnVar1->http_flags = pnVar1->http_flags | 0x400;
    session_local._4_4_ = 0;
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_upgrade(nghttp2_session *session,
                            const uint8_t *settings_payload,
                            size_t settings_payloadlen,
                            void *stream_user_data) {
  int rv;
  nghttp2_stream *stream;

  rv = nghttp2_session_upgrade_internal(session, settings_payload,
                                        settings_payloadlen, stream_user_data);
  if (rv != 0) {
    return rv;
  }

  stream = nghttp2_session_get_stream(session, 1);
  assert(stream);

  /* We have no information about request header fields when Upgrade
     was happened.  So we don't know the request method here.  If
     request method is HEAD, we have a trouble because we may have
     nonzero content-length header field in response headers, and we
     will going to check it against the actual DATA frames, but we may
     get mismatch because HEAD response body must be empty.  Because
     of this reason, nghttp2_session_upgrade() was deprecated in favor
     of nghttp2_session_upgrade2(), which has |head_request| parameter
     to indicate that request method is HEAD or not. */
  stream->http_flags |= NGHTTP2_HTTP_FLAG_METH_UPGRADE_WORKAROUND;
  return 0;
}